

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O0

void UCNV_FROM_U_CALLBACK_STOP_63
               (void *context,UConverterFromUnicodeArgs *fromUArgs,UChar *codeUnits,int32_t length,
               UChar32 codePoint,UConverterCallbackReason reason,UErrorCode *err)

{
  UConverterCallbackReason reason_local;
  UChar32 codePoint_local;
  int32_t length_local;
  UChar *codeUnits_local;
  UConverterFromUnicodeArgs *fromUArgs_local;
  void *context_local;
  
  if ((reason == UCNV_UNASSIGNED) &&
     (((((((codePoint == 0xad || (codePoint == 0x34f)) || (codePoint == 0x61c)) ||
         ((codePoint == 0x115f || (codePoint == 0x1160)))) ||
        (((0x17b3 < codePoint && (codePoint < 0x17b6)) ||
         ((0x180a < codePoint && (codePoint < 0x180f)))))) ||
       (((((0x200a < codePoint && (codePoint < 0x2010)) ||
          ((((0x2029 < codePoint && (codePoint < 0x202f)) ||
            ((0x205f < codePoint && (codePoint < 0x2070)))) || (codePoint == 0x3164)))) ||
         ((((0xfdff < codePoint && (codePoint < 0xfe10)) || (codePoint == 0xfeff)) ||
          ((codePoint == 0xffa0 || ((0xffef < codePoint && (codePoint < 0xfff9)))))))) ||
        ((0x1bc9f < codePoint && (codePoint < 0x1bca4)))))) ||
      (((0x1d172 < codePoint && (codePoint < 0x1d17b)) ||
       ((0xdffff < codePoint && (codePoint < 0xe1000)))))))) {
    *err = U_ZERO_ERROR;
  }
  return;
}

Assistant:

U_CAPI void    U_EXPORT2
UCNV_FROM_U_CALLBACK_STOP (
                  const void *context,
                  UConverterFromUnicodeArgs *fromUArgs,
                  const UChar* codeUnits,
                  int32_t length,
                  UChar32 codePoint,
                  UConverterCallbackReason reason,
                  UErrorCode * err)
{
    (void)context;
    (void)fromUArgs;
    (void)codeUnits;
    (void)length;
    if (reason == UCNV_UNASSIGNED && IS_DEFAULT_IGNORABLE_CODE_POINT(codePoint))
    {
        /*
         * Skip if the codepoint has unicode property of default ignorable.
         */
        *err = U_ZERO_ERROR;
    }
    /* the caller must have set the error code accordingly */
    return;
}